

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

void __thiscall
RenX_ServerListPlugin::addServerToServerList(RenX_ServerListPlugin *this,Server *server)

{
  string *this_00;
  string server_json_block;
  string local_30;
  
  server_json_block._M_dataplus._M_p = (pointer)&server_json_block.field_2;
  server_json_block._M_string_length = 0;
  server_json_block.field_2._M_local_buf[0] = '\0';
  server_as_json_abi_cxx11_(&local_30,this,server);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&server_json_block,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this_00 = &this->m_server_list_json;
  if ((this->m_server_list_json)._M_string_length < 3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,'[');
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this_00,',');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,&server_json_block);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,']');
  updateMetadata(this);
  std::__cxx11::string::~string((string *)&server_json_block);
  return;
}

Assistant:

void RenX_ServerListPlugin::addServerToServerList(RenX::Server &server) {
	std::string server_json_block;

	// append to server_list_json
	server_json_block = server_as_json(server);
	if (m_server_list_json.size() <= 2) {
		m_server_list_json = '[';
	}
	else {
		m_server_list_json.pop_back(); // remove trailing ']'.
		m_server_list_json += ',';
	}
	m_server_list_json += server_json_block;
	m_server_list_json += ']';

	// Also update metadata so it reflects the now added server
	updateMetadata();
}